

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * soul::Value::createFloatVectorArray(InterleavedView<float> data)

{
  float *pfVar1;
  float *pfVar2;
  ChannelCount chan;
  ChannelCount channel;
  uint uVar3;
  Value *in_RDI;
  bool bVar4;
  SampleIterator<float> SVar5;
  SampleIterator<float> SVar6;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  Type local_68;
  PrimitiveType local_4c;
  Type local_48;
  
  local_4c.type = float32;
  Type::createVector(&local_68,&local_4c,(ulong)in_stack_00000018);
  Type::createArray(&local_48,&local_68,(ulong)in_stack_0000001c);
  Value(in_RDI,&local_48);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_68.structure);
  getAsChannelSet32((InterleavedView<float> *)&local_68,in_RDI);
  if ((in_stack_00000018 == (ChannelCount)local_68.structure.object) &&
     (in_stack_0000001c == (uint)((ulong)local_68.structure.object >> 0x20))) {
    for (channel = 0; channel != in_stack_00000018; channel = channel + 1) {
      SVar5 = choc::buffer::BufferView<float,_choc::buffer::InterleavedLayout>::getIterator
                        ((BufferView<float,_choc::buffer::InterleavedLayout> *)&stack0x00000008,
                         channel);
      pfVar1 = SVar5.sample;
      SVar6 = choc::buffer::BufferView<float,_choc::buffer::InterleavedLayout>::getIterator
                        ((BufferView<float,_choc::buffer::InterleavedLayout> *)&local_68,channel);
      pfVar2 = SVar6.sample;
      uVar3 = in_stack_0000001c;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        *pfVar2 = *pfVar1;
        pfVar1 = pfVar1 + SVar5.stride;
        pfVar2 = pfVar2 + (SVar6._8_8_ & 0xffffffff);
      }
    }
    return in_RDI;
  }
  throwInternalCompilerError("size == dest.getSize()","copy",0x2e1);
}

Assistant:

Value Value::createFloatVectorArray (choc::buffer::InterleavedView<float> data)
{
    Value v (Type::createVector (PrimitiveType::float32, data.getNumChannels()).createArray (data.getNumFrames()));
    copy (v.getAsChannelSet32(), data);
    return v;
}